

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::global<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  __index_type *__rhs;
  undefined8 uVar1;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var2;
  bool bVar3;
  __index_type *p_Var4;
  string_view expected;
  undefined1 local_130 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  string local_e8;
  undefined1 local_c8 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  Result<wasm::Ok> _val_3;
  Result<wasm::WATParser::GlobalType> type;
  Result<wasm::WATParser::GlobalType> _val_2;
  
  this = &ctx->in;
  expected._M_str = "global";
  expected._M_len = 6;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_130,this);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_130,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_c8,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_130);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(string *)local_c8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_c8);
    goto LAB_00c3a926;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_c8);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_c8,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_c8
            );
  if (type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ == '\x02') {
    std::__cxx11::string::string
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20),
               (string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    globaltype<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::GlobalType> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    __rhs = (__index_type *)
            ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)__rhs);
    if (_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ == '\x01')
    {
      std::__cxx11::string::string
                ((string *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20),(string *)
                         ((long)&type.val.
                                 super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                         0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                .super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                        0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                .super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                        0x20));
      if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
          _24_1_ == '\x01') {
        expr<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20),
                   ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                           0x20));
        if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&import.val.
                             super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                     + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&exports.val.
                              super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                              .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                              super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                              super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                              super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&import.val.
                             super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                     + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20))
          ;
          goto LAB_00c3a911;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
      }
      bVar3 = Lexer::takeRParen(this);
      if (bVar3) {
        p_Var4 = (__index_type *)0x0;
        if (type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ == '\0'
           ) {
          p_Var4 = __rhs;
        }
        uVar1 = *(undefined8 *)(p_Var4 + 8);
        _Var2._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             (ctx->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[ctx->index]._M_t.
             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
        *(bool *)((long)_Var2._M_t.
                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) =
             _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_4_ != 0;
        *(undefined8 *)
         ((long)_Var2._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = uVar1;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"expected end of global",
                   (allocator<char> *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20));
        Lexer::err((Err *)((long)&type.val.
                                  super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                          0x20),this,&local_e8);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
        std::__cxx11::string::~string((string *)&local_e8);
      }
    }
LAB_00c3a911:
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_c8);
LAB_00c3a926:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_130);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> global(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("global"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = globaltype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::ExprT> exp;
  if (!import) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    exp = *e;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of global");
  }

  CHECK_ERR(ctx.addGlobal(name, *exports, import.getPtr(), *type, exp, pos));
  return Ok{};
}